

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O1

int main(void)

{
  undefined8 ******ppppppuVar1;
  double dVar2;
  undefined8 ******ppppppuVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  RTPPacket *p;
  ostream *poVar8;
  int *piVar9;
  int errcode;
  int errcode_00;
  int errcode_01;
  string *this;
  undefined1 auVar10 [16];
  timespec tpMono;
  RTPTime delay;
  timespec tpMono_1;
  uint8_t silencebuffer [160];
  RTPUDPv4TransmissionParams transparams;
  RTPSessionParams sessionparams;
  RTPSession session;
  string sStack_109e8;
  double dStack_109c8;
  RTPTime RStack_109c0;
  timespec tStack_109b8;
  string asStack_109a8 [5];
  RTPTransmissionParams RStack_10908;
  undefined8 uStack_108f8;
  undefined8 *****pppppuStack_108f0;
  undefined8 *****pppppuStack_108e8;
  undefined8 uStack_108e0;
  undefined1 uStack_108d8;
  undefined8 uStack_108d4;
  undefined8 uStack_108cc;
  undefined5 uStack_108c4;
  undefined3 uStack_108bf;
  undefined5 uStack_108bc;
  undefined8 uStack_108b0;
  undefined1 auStack_108a8 [12];
  undefined8 uStack_1089c;
  RTPSessionParams RStack_10890;
  RTPSession RStack_107e8;
  
  jrtplib::RTPSession::RTPSession(&RStack_107e8,(RTPRandom *)0x0,(RTPMemoryManager *)0x0);
  jrtplib::RTPSessionParams::RTPSessionParams(&RStack_10890);
  RStack_10890.owntsunit = 0.000125;
  RStack_10908.protocol = IPv4UDPProto;
  RStack_10908._vptr_RTPTransmissionParams = (_func_int **)&PTR__RTPUDPv4TransmissionParams_0013aea0
  ;
  uStack_108e0 = 0;
  uStack_108f8 = 0;
  uStack_108d8 = 1;
  uStack_108d4 = 0x800000008000;
  uStack_108cc = 0x800000008000;
  uStack_108b0 = 0;
  uStack_108c4 = 0;
  uStack_108bf = 0;
  uStack_108bc = 0;
  RStack_10908._12_2_ = 8000;
  pppppuStack_108f0 = &pppppuStack_108f0;
  pppppuStack_108e8 = &pppppuStack_108f0;
  uVar6 = jrtplib::RTPSession::Create(&RStack_107e8,&RStack_10890,&RStack_10908,IPv4UDPProto);
  if ((int)uVar6 < 0) {
    jrtplib::RTPGetErrorString_abi_cxx11_(asStack_109a8,(jrtplib *)(ulong)uVar6,errcode);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,asStack_109a8[0]._M_dataplus._M_p,
                        asStack_109a8[0]._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  else {
    auStack_108a8._8_4_ = IPv4Address;
    auStack_108a8._0_8_ = &PTR_CreateCopy_0013bbb0;
    uStack_1089c = 0x232923287f000001;
    uVar6 = jrtplib::RTPSession::AddDestination(&RStack_107e8,(RTPAddress *)auStack_108a8);
    if (-1 < (int)uVar6) {
      jrtplib::RTPSession::SetDefaultPayloadType(&RStack_107e8,'`');
      jrtplib::RTPSession::SetDefaultMark(&RStack_107e8,false);
      jrtplib::RTPSession::SetDefaultTimestampIncrement(&RStack_107e8,0xa0);
      memset(asStack_109a8,0x80,0xa0);
      RStack_109c0.m_t = 0.02;
      if (jrtplib::RTPTime::CurrentTime()::s_initialized == '\0') {
        jrtplib::RTPTime::CurrentTime()::s_initialized = '\x01';
        clock_gettime(0,(timespec *)&sStack_109e8);
        clock_gettime(1,&tStack_109b8);
        dStack_109c8 = (double)(long)sStack_109e8._M_string_length * 1e-09 +
                       (double)(long)sStack_109e8._M_dataplus._M_p;
        jrtplib::RTPTime::CurrentTime()::s_startOffet =
             dStack_109c8 - ((double)tStack_109b8.tv_nsec * 1e-09 + (double)tStack_109b8.tv_sec);
      }
      else {
        clock_gettime(1,(timespec *)&sStack_109e8);
        dStack_109c8 = (double)(long)sStack_109e8._M_string_length * 1e-09 +
                       (double)(long)sStack_109e8._M_dataplus._M_p +
                       jrtplib::RTPTime::CurrentTime()::s_startOffet;
      }
      bVar5 = false;
      while (uVar6 = jrtplib::RTPSession::SendPacket(&RStack_107e8,asStack_109a8,0xa0),
            -1 < (int)uVar6) {
        jrtplib::RTPSession::BeginDataAccess(&RStack_107e8);
        bVar4 = jrtplib::RTPSession::GotoFirstSource(&RStack_107e8);
        while (bVar4 != false) {
          while (p = jrtplib::RTPSession::GetNextPacket(&RStack_107e8), p != (RTPPacket *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Got packet with ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"extended sequence number ",0x19);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," from SSRC ",0xb);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            jrtplib::RTPSession::DeletePacket(&RStack_107e8,p);
          }
          bVar4 = jrtplib::RTPSession::GotoNextSource(&RStack_107e8);
        }
        jrtplib::RTPSession::EndDataAccess(&RStack_107e8);
        if (0.0 < RStack_109c0.m_t) {
          sStack_109e8._M_dataplus._M_p =
               (pointer)((long)(RStack_109c0.m_t - 9.223372036854776e+18) &
                         (long)RStack_109c0.m_t >> 0x3f | (long)RStack_109c0.m_t);
          auVar10._8_4_ = (int)((ulong)sStack_109e8._M_dataplus._M_p >> 0x20);
          auVar10._0_8_ = sStack_109e8._M_dataplus._M_p;
          auVar10._12_4_ = 0x45300000;
          sStack_109e8._M_string_length =
               (long)((RStack_109c0.m_t -
                      ((auVar10._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)sStack_109e8._M_dataplus._M_p) -
                      4503599627370496.0))) * 1000000000.0) & 0xffffffff;
          do {
            iVar7 = nanosleep((timespec *)&sStack_109e8,&tStack_109b8);
            sStack_109e8._M_dataplus._M_p = (pointer)tStack_109b8.tv_sec;
            sStack_109e8._M_string_length = tStack_109b8.tv_nsec;
            if (iVar7 != -1) break;
            piVar9 = __errno_location();
          } while (*piVar9 == 4);
        }
        if (jrtplib::RTPTime::CurrentTime()::s_initialized == '\0') {
          jrtplib::RTPTime::CurrentTime()::s_initialized = '\x01';
          clock_gettime(0,(timespec *)&sStack_109e8);
          clock_gettime(1,&tStack_109b8);
          dVar2 = (double)(long)sStack_109e8._M_string_length * 1e-09 +
                  (double)(long)sStack_109e8._M_dataplus._M_p;
          jrtplib::RTPTime::CurrentTime()::s_startOffet =
               dVar2 - ((double)tStack_109b8.tv_nsec * 1e-09 + (double)tStack_109b8.tv_sec);
        }
        else {
          clock_gettime(1,(timespec *)&sStack_109e8);
          dVar2 = (double)(long)sStack_109e8._M_string_length * 1e-09 +
                  (double)(long)sStack_109e8._M_dataplus._M_p +
                  jrtplib::RTPTime::CurrentTime()::s_startOffet;
        }
        if (60.0 < dVar2 - dStack_109c8) {
          bVar5 = true;
        }
        if (bVar5) {
          RStack_109c0.m_t = 10.0;
          jrtplib::RTPSession::BYEDestroy(&RStack_107e8,&RStack_109c0,"Time\'s up",9);
          RStack_10908._vptr_RTPTransmissionParams =
               (_func_int **)&PTR__RTPUDPv4TransmissionParams_0013aea0;
          ppppppuVar3 = (undefined8 ******)pppppuStack_108f0;
          while (ppppppuVar3 != &pppppuStack_108f0) {
            ppppppuVar1 = (undefined8 ******)*ppppppuVar3;
            operator_delete(ppppppuVar3,0x18);
            ppppppuVar3 = ppppppuVar1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)RStack_10890.cname._M_dataplus._M_p != &RStack_10890.cname.field_2) {
            operator_delete(RStack_10890.cname._M_dataplus._M_p,
                            RStack_10890.cname.field_2._M_allocated_capacity + 1);
          }
          jrtplib::RTPSession::~RTPSession(&RStack_107e8);
          return 0;
        }
      }
      jrtplib::RTPGetErrorString_abi_cxx11_(&sStack_109e8,(jrtplib *)(ulong)uVar6,errcode_01);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,sStack_109e8._M_dataplus._M_p,
                          sStack_109e8._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar8);
      this = &sStack_109e8;
      goto LAB_00119d69;
    }
    jrtplib::RTPGetErrorString_abi_cxx11_(asStack_109a8,(jrtplib *)(ulong)uVar6,errcode_00);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,asStack_109a8[0]._M_dataplus._M_p,
                        asStack_109a8[0]._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  this = asStack_109a8;
LAB_00119d69:
  std::__cxx11::string::~string((string *)this);
  exit(-1);
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
		
	RTPSession session;
	
	RTPSessionParams sessionparams;
	sessionparams.SetOwnTimestampUnit(1.0/8000.0);
			
	RTPUDPv4TransmissionParams transparams;
	transparams.SetPortbase(8000);
			
	int status = session.Create(sessionparams,&transparams);
	if (status < 0)
	{
		std::cerr << RTPGetErrorString(status) << std::endl;
		exit(-1);
	}
	
	uint8_t localip[]={127,0,0,1};
	RTPIPv4Address addr(localip,9000);
	
	status = session.AddDestination(addr);
	if (status < 0)
	{
		std::cerr << RTPGetErrorString(status) << std::endl;
		exit(-1);
	}
	
	session.SetDefaultPayloadType(96);
	session.SetDefaultMark(false);
	session.SetDefaultTimestampIncrement(160);
	
	uint8_t silencebuffer[160];
	for (int i = 0 ; i < 160 ; i++)
		silencebuffer[i] = 128;

	RTPTime delay(0.020);
	RTPTime starttime = RTPTime::CurrentTime();
	
	bool done = false;
	while (!done)
	{
		status = session.SendPacket(silencebuffer,160);
		if (status < 0)
		{
			std::cerr << RTPGetErrorString(status) << std::endl;
			exit(-1);
		}
		
		session.BeginDataAccess();
		if (session.GotoFirstSource())
		{
			do
			{
				RTPPacket *packet;

				while ((packet = session.GetNextPacket()) != 0)
				{
					std::cout << "Got packet with " 
					          << "extended sequence number " 
					          << packet->GetExtendedSequenceNumber() 
					          << " from SSRC " << packet->GetSSRC() 
					          << std::endl;
					session.DeletePacket(packet);
				}
			} while (session.GotoNextSource());
		}
		session.EndDataAccess();
			
		RTPTime::Wait(delay);
		
		RTPTime t = RTPTime::CurrentTime();
		t -= starttime;
		if (t > RTPTime(60.0))
			done = true;
	}
	
	delay = RTPTime(10.0);
	session.BYEDestroy(delay,"Time's up",9);
	
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}